

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hh
# Opt level: O3

vector<double,_std::allocator<double>_> *
randvector(vector<double,_std::allocator<double>_> *__return_storage_ptr__,int n)

{
  pointer pdVar1;
  vector<double,_std::allocator<double>_> *__range1;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>,_double>
  __aurng;
  double *x;
  pointer pdVar2;
  double dVar3;
  allocator_type local_21;
  
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,(long)n,&local_21);
  pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    dVar3 = std::
            generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                      (&Arguments::random_generator);
    *pdVar2 = dVar3 * (distribution_real._M_param._M_b - distribution_real._M_param._M_a) +
              distribution_real._M_param._M_a;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> randvector(int n) {
	vector<double> v(n);
	for (double& x : v) x = randdouble();
	return v;
}